

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O1

void okim6258_set_options(void *chip,UINT32 Options)

{
  undefined2 uVar1;
  
  uVar1 = 0xffff;
  *(byte *)((long)chip + 0x18) = (byte)Options & 1;
  if ((Options & 1) == 0) {
    uVar1 = (undefined2)(-1 << (0xcU - *(char *)((long)chip + 0x19) & 0x1f));
  }
  *(undefined2 *)((long)chip + 0x1a) = uVar1;
  return;
}

Assistant:

static void okim6258_set_options(void *chip, UINT32 Options)
{
	okim6258_state *info = (okim6258_state *)chip;
	
	info->output_12force = (Options >> 0) & 0x01;
	if (info->output_12force)
		info->output_mask = ~0;
	else
		info->output_mask = ~((1 << (12 - info->output_bits)) - 1);
	
	return;
}